

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

Message * __thiscall
google::protobuf::Reflection::UnsafeArenaReleaseMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  uint *puVar1;
  uint uVar2;
  long lVar3;
  Message *pMVar4;
  byte bVar5;
  uint32 uVar6;
  MessageLite *pMVar7;
  ulong uVar8;
  FieldDescriptor *local_30;
  _func_void_FieldDescriptor_ptr *local_28;
  
  if (*(Descriptor **)(field + 0x50) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"ReleaseMessage","Field does not match message type.");
  }
  if (*(int *)(field + 0x3c) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"ReleaseMessage",
               "Field is repeated; the method requires a singular field.");
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_28 = FieldDescriptor::TypeOnceInit;
    local_30 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),&local_28,&local_30);
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) != 10) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"ReleaseMessage",CPPTYPE_MESSAGE);
  }
  if (field[0x42] == (FieldDescriptor)0x1) {
    if (factory == (MessageFactory *)0x0) {
      factory = this->message_factory_;
    }
    pMVar7 = internal::ExtensionSet::UnsafeArenaReleaseMessage
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite +
                        (ulong)(uint)(this->schema_).extensions_offset_),field,factory);
    return (Message *)pMVar7;
  }
  lVar3 = *(long *)(field + 0x58);
  if (*(int *)(field + 0x3c) == 3) {
    if (lVar3 == 0) goto LAB_00284f93;
  }
  else if (lVar3 == 0) {
    uVar8 = (ulong)(uint)(this->schema_).has_bits_offset_;
    if (uVar8 != 0xffffffff) {
      uVar2 = (this->schema_).has_bit_indices_
              [(int)((ulong)((long)field - *(long *)(*(long *)(field + 0x50) + 0x28)) >> 3) *
               0x286bca1b];
      bVar5 = (byte)uVar2 & 0x1f;
      puVar1 = (uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                       (ulong)(uVar2 >> 5) * 4 + uVar8);
      *puVar1 = *puVar1 & (-2 << bVar5 | 0xfffffffeU >> 0x20 - bVar5);
    }
    goto LAB_00284f93;
  }
  uVar8 = (ulong)(uint)((int)((ulong)(lVar3 - *(long *)(*(long *)(lVar3 + 0x10) + 0x30)) >> 4) *
                        -0x55555554 + (this->schema_).oneof_case_offset_);
  if (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar8) !=
      *(int *)(field + 0x44)) {
    return (Message *)0x0;
  }
  *(undefined4 *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar8) = 0;
LAB_00284f93:
  uVar6 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
  pMVar4 = *(Message **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar6);
  *(undefined8 *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar6) = 0;
  return pMVar4;
}

Assistant:

Message* Reflection::UnsafeArenaReleaseMessage(Message* message,
                                               const FieldDescriptor* field,
                                               MessageFactory* factory) const {
  USAGE_CHECK_ALL(ReleaseMessage, SINGULAR, MESSAGE);

  if (factory == nullptr) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->UnsafeArenaReleaseMessage(field,
                                                                factory));
  } else {
    if (!(field->is_repeated() || field->containing_oneof())) {
      ClearBit(message, field);
    }
    if (field->containing_oneof()) {
      if (HasOneofField(*message, field)) {
        *MutableOneofCase(message, field->containing_oneof()) = 0;
      } else {
        return nullptr;
      }
    }
    Message** result = MutableRaw<Message*>(message, field);
    Message* ret = *result;
    *result = nullptr;
    return ret;
  }
}